

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<elf_prpsinfo,_char> *jo)

{
  size_t sVar1;
  JObject *pJVar2;
  ostream *poVar3;
  char *pcVar4;
  char local_d1 [9];
  int local_c8;
  char local_c1;
  int local_c0;
  char local_bc;
  bool local_bb;
  char local_ba;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char local_95;
  int local_94;
  JObject local_90;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string args;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string fname;
  elf_prpsinfo *pr;
  JSON<elf_prpsinfo,_char> *jo_local;
  ostream *os_local;
  
  fname.field_2._8_8_ = jo->object;
  pcVar4 = ((elf_prpsinfo *)fname.field_2._8_8_)->pr_fname;
  sVar1 = strnlen(pcVar4,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,pcVar4,sVar1,&local_41);
  std::allocator<char>::~allocator(&local_41);
  pcVar4 = (char *)(fname.field_2._8_8_ + 0x38);
  sVar1 = strnlen(pcVar4,0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,pcVar4,sVar1,&local_79);
  std::allocator<char>::~allocator(&local_79);
  JObject::JObject(&local_90,os);
  local_94 = (int)*(char *)fname.field_2._8_8_;
  local_95 = '\0';
  pJVar2 = JObject::field<char[9],int,char>(&local_90,(char (*) [9])"pr_state",&local_94,&local_95);
  pcVar4 = (char *)(fname.field_2._8_8_ + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,pcVar4,1,&local_b9);
  local_ba = '\0';
  pJVar2 = JObject::field<char[9],std::__cxx11::string,char>
                     (pJVar2,(char (*) [9])"pr_sname",&local_b8,&local_ba);
  local_bb = *(char *)(fname.field_2._8_8_ + 2) != '\0';
  local_bc = '\0';
  pJVar2 = JObject::field<char[8],bool,char>(pJVar2,(char (*) [8])"pr_zomb",&local_bb,&local_bc);
  local_c0 = (int)*(char *)(fname.field_2._8_8_ + 3);
  local_c1 = '\0';
  pJVar2 = JObject::field<char[8],int,char>(pJVar2,(char (*) [8])"pr_nice",&local_c0,&local_c1);
  local_c8 = *(int *)(fname.field_2._8_8_ + 8);
  local_d1[8] = 0;
  pJVar2 = JObject::field<char[8],int,char>(pJVar2,(char (*) [8])"pr_flag",&local_c8,local_d1 + 8);
  local_d1[7] = 0;
  pJVar2 = JObject::field<char[7],unsigned_int,char>
                     (pJVar2,(char (*) [7])"pr_uid",(uint *)(fname.field_2._8_8_ + 0x10),
                      local_d1 + 7);
  local_d1[6] = 0;
  pJVar2 = JObject::field<char[7],unsigned_int,char>
                     (pJVar2,(char (*) [7])"pr_gid",(uint *)(fname.field_2._8_8_ + 0x14),
                      local_d1 + 6);
  local_d1[5] = 0;
  pJVar2 = JObject::field<char[7],int,char>
                     (pJVar2,(char (*) [7])"pr_pid",(int *)(fname.field_2._8_8_ + 0x18),local_d1 + 5
                     );
  local_d1[4] = 0;
  pJVar2 = JObject::field<char[8],int,char>
                     (pJVar2,(char (*) [8])"pr_ppid",(int *)(fname.field_2._8_8_ + 0x1c),
                      local_d1 + 4);
  local_d1[3] = 0;
  pJVar2 = JObject::field<char[8],int,char>
                     (pJVar2,(char (*) [8])"pr_pgrp",(int *)(fname.field_2._8_8_ + 0x20),
                      local_d1 + 3);
  local_d1[2] = 0;
  pJVar2 = JObject::field<char[7],int,char>
                     (pJVar2,(char (*) [7])"pr_sid",(int *)(fname.field_2._8_8_ + 0x24),local_d1 + 2
                     );
  local_d1[1] = 0;
  pJVar2 = JObject::field<char[9],std::__cxx11::string,char>
                     (pJVar2,(char (*) [9])"pr_fname",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                      local_d1 + 1);
  local_d1[0] = '\0';
  pJVar2 = JObject::field<char[8],std::__cxx11::string,char>
                     (pJVar2,(char (*) [8])"pr_args",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      local_d1);
  poVar3 = JObject::operator_cast_to_ostream_(pJVar2);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  JObject::~JObject(&local_90);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return poVar3;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<prpsinfo_t> &jo)
{
    auto &pr = jo.object;

    std::string fname = { pr.pr_fname, strnlen( pr.pr_fname, sizeof pr.pr_fname ) };
    std::string args = { pr.pr_psargs, strnlen( pr.pr_psargs, sizeof pr.pr_psargs ) };

    return JObject(os)
        .field("pr_state", int( pr.pr_state ) )
        .field("pr_sname", std::string(&pr.pr_sname, 1))
        .field("pr_zomb", bool(pr.pr_zomb))
        .field("pr_nice", int (pr.pr_nice))
        .field("pr_flag", int(pr.pr_flag))
        .field("pr_uid", pr.pr_uid )
        .field("pr_gid", pr.pr_gid )
        .field("pr_pid", pr.pr_pid )
        .field("pr_ppid", pr.pr_ppid )
        .field("pr_pgrp", pr.pr_pgrp )
        .field("pr_sid", pr.pr_sid )
        .field("pr_fname", fname )
        .field("pr_args", args )
              ;
}